

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node * lyd_new_dummy(lyd_node *root,lyd_node *parent,lys_node *schema,char *value,int dflt)

{
  lyd_node **pplVar1;
  uint uVar2;
  LYS_NODE LVar3;
  lys_node *schema_00;
  uint uVar4;
  int iVar5;
  ly_set *set;
  lyd_node *plVar6;
  LY_ERR *pLVar7;
  lyd_node *plVar8;
  ulong uVar9;
  bool bVar10;
  
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x5ff,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  if ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN) {
    __assert_fail("schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x601,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  set = (ly_set *)calloc(1,0x10);
  if (set == (ly_set *)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EMEM;
    plVar8 = (lyd_node *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_new_dummy");
  }
  else {
    if (root != (lyd_node *)0x0 && parent == (lyd_node *)0x0) {
      do {
        pplVar1 = &root->parent;
        plVar8 = root;
        root = *pplVar1;
      } while (*pplVar1 != (lyd_node *)0x0);
      do {
        root = plVar8;
        plVar8 = root->prev;
      } while (root->prev->next != (lyd_node *)0x0);
    }
    do {
      if ((parent != (lyd_node *)0x0) && (parent->schema == schema)) break;
      if ((schema->nodetype & 0xc1bd) != LYS_UNKNOWN) {
        ly_set_add(set,schema,1);
      }
      schema = lys_parent(schema);
    } while (schema != (lys_node *)0x0);
    uVar2 = set->number;
    if (uVar2 == 0) {
      __assert_fail("spath->number > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x61d,
                    "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                   );
    }
    uVar4 = uVar2;
    if (parent == (lyd_node *)0x0) {
      parent = (lyd_node *)0x0;
      if ((((set->set).s[uVar2 - 1]->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) &&
         (root != (lyd_node *)0x0)) {
        do {
          parent = root;
          uVar4 = uVar2 - 1;
          if (root->schema == (set->set).s[uVar2 - 1]) break;
          root = root->next;
          parent = (lyd_node *)0x0;
          uVar4 = uVar2;
        } while (root != (lyd_node *)0x0);
      }
    }
    if (uVar4 != 0 && parent != (lyd_node *)0x0) {
      plVar8 = parent;
      while( true ) {
        parent = plVar8;
        if (((set->set).s[uVar4 - 1]->nodetype & LYS_LEAFLIST) != LYS_UNKNOWN) break;
        plVar6 = plVar8->child;
        if (plVar6 == (lyd_node *)0x0) {
          bVar10 = false;
          uVar2 = uVar4;
        }
        else {
          do {
            bVar10 = plVar6->schema == (set->set).s[uVar4 - 1];
            parent = plVar6;
            uVar2 = uVar4 - 1;
            if (bVar10) break;
            plVar6 = plVar6->next;
            parent = plVar8;
            uVar2 = uVar4;
          } while (plVar6 != (lyd_node *)0x0);
        }
        uVar4 = uVar2;
        if ((!bVar10) || (plVar8 = parent, uVar4 == 0)) break;
      }
    }
    if (uVar4 == 0) {
      plVar8 = (lyd_node *)0x0;
    }
    else {
      uVar9 = (ulong)uVar4;
      plVar8 = (lyd_node *)0x0;
      do {
        schema_00 = (set->set).s[uVar9 - 1];
        LVar3 = schema_00->nodetype;
        if ((int)LVar3 < 0x10) {
          if (LVar3 == LYS_CONTAINER) goto LAB_0015e90d;
          if ((LVar3 != LYS_LEAF) && (LVar3 != LYS_LEAFLIST)) goto LAB_0015ea17;
          if (value == (char *)0x0) {
            plVar6 = lyd_create_leaf(schema_00,(char *)0x0,dflt);
            if (((plVar6 != (lyd_node *)0x0) && (parent != (lyd_node *)0x0)) &&
               (iVar5 = lyd_insert(parent,plVar6), iVar5 != 0)) {
              lyd_free(plVar6);
              goto LAB_0015ea17;
            }
          }
          else {
            plVar6 = _lyd_new_leaf(parent,schema_00,value,dflt);
          }
        }
        else if (LVar3 == LYS_LIST) {
LAB_0015e90d:
          plVar6 = _lyd_new(parent,schema_00,dflt);
        }
        else {
          if ((LVar3 != LYS_ANYXML) && (LVar3 != LYS_ANYDATA)) goto LAB_0015ea17;
          plVar6 = lyd_create_anydata(parent,schema_00,"",LYD_ANYDATA_CONSTSTRING);
        }
        if (plVar6 == (lyd_node *)0x0) {
          pLVar7 = ly_errno_location();
          *pLVar7 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x652);
LAB_0015ea17:
          free((set->set).s);
          free(set);
          lyd_free(plVar8);
          return (lyd_node *)0x0;
        }
        uVar9 = uVar9 - 1;
        plVar6->validity = 0x80;
        if (plVar8 == (lyd_node *)0x0) {
          plVar8 = plVar6;
        }
        parent = plVar6;
      } while (uVar9 != 0);
    }
    free((set->set).s);
    free(set);
  }
  return plVar8;
}

Assistant:

struct lyd_node *
lyd_new_dummy(struct lyd_node *root, struct lyd_node *parent, const struct lys_node *schema, const char *value, int dflt)
{
    unsigned int index;
    struct ly_set *spath;
    const struct lys_node *siter;
    struct lyd_node *iter, *dummy = NULL;

    assert(schema);
    assert(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF |
                               LYS_RPC | LYS_ACTION));

    spath = ly_set_new();
    if (!spath) {
        LOGMEM;
        return NULL;
    }

    if (!parent && root) {
        /* find data root */
        for (; root->parent; root = root->parent);   /* vertical move (up) */
        for (; root->prev->next; root = root->prev); /* horizontal move (left) */
    }

    /* build schema path */
    for (siter = schema; siter; siter = lys_parent(siter)) {
        /* stop if we know some of the parents */
        if (parent && parent->schema == siter) {
            break;
        }

        if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF |
                               LYS_RPC | LYS_ACTION)) {
            /* we have a node that can appear in data tree */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);
        } /* else skip the rest node types */
    }

    assert(spath->number > 0);
    index = spath->number;
    if (!parent && !(spath->set.s[index - 1]->nodetype & LYS_LEAFLIST)) {
        /* start by searching for the top-level parent */
        LY_TREE_FOR(root, iter) {
            if (iter->schema == spath->set.s[index - 1]) {
                parent = iter;
                index--;
                break;
            }
        }
    }

    iter = parent;
    while (iter && index && !(spath->set.s[index - 1]->nodetype & LYS_LEAFLIST)) {
        /* search for closer parent on the path */
        LY_TREE_FOR(parent->child, iter) {
            if (iter->schema == spath->set.s[index - 1]) {
                index--;
                parent = iter;
                break;
            }
        }
    }
    while(index) {
        /* create the missing part of the path */
        switch (spath->set.s[index - 1]->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
            if (value) {
                iter = _lyd_new_leaf(parent, spath->set.s[index - 1], value, dflt);
            } else {
                iter = lyd_create_leaf(spath->set.s[index - 1], value, dflt);
                if (iter && parent) {
                    if (lyd_insert(parent, iter)) {
                        lyd_free(iter);
                        goto error;
                    }
                }
            }
            break;
        case LYS_CONTAINER:
        case LYS_LIST:
            iter = _lyd_new(parent, spath->set.s[index - 1], dflt);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            iter = lyd_create_anydata(parent, spath->set.s[index - 1], "", LYD_ANYDATA_CONSTSTRING);
            break;
        default:
            goto error;
        }
        if (!iter) {
            LOGINT;
            goto error;
        }

        /* we say it is valid and it is dummy */
        iter->validity = LYD_VAL_INUSE;

        if (!dummy) {
            dummy = iter;
        }

        /* continue */
        parent = iter;
        index--;
    }

    ly_set_free(spath);


    return dummy;

error:
    ly_set_free(spath);
    lyd_free(dummy);
    return NULL;
}